

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateSurfaceTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::anon_unknown_4::CreateWindowSurfaceCase::executeForConfig
          (CreateWindowSurfaceCase *this,EGLDisplay display,EGLConfig config)

{
  bool bVar1;
  TestLog *pTVar2;
  NativeDisplay *pNVar3;
  EGLint EVar4;
  deUint32 dVar5;
  int iVar6;
  Library *egl;
  NativeWindowFactory *pNVar7;
  NotSupportedError *this_00;
  undefined4 extraout_var;
  Library *egl_00;
  undefined4 extraout_var_01;
  EGLSurface surface_00;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  char *platformExt;
  EGLint windowHeight;
  EGLDisplay local_1f8;
  EGLint windowWidth;
  EGLConfig local_1e8;
  TestLog *local_1e0;
  UniqueSurface surface;
  UniquePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> window;
  undefined1 local_1b0 [8];
  Visibility local_1a8;
  NativeWindow *pNVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_02;
  
  egl = EglTestContext::getLibrary((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
  pTVar2 = ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
           m_log;
  local_1f8 = display;
  local_1e8 = config;
  EVar4 = eglu::getConfigID(egl,display,config);
  pNVar7 = eglu::selectNativeWindowFactory
                     (((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->
                      m_nativeDisplayFactory,
                      ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx)->m_cmdLine);
  if (this->m_useLegacyCreate == true) {
    if ((pNVar7->m_capabilities & CAPABILITY_CREATE_SURFACE_LEGACY) != 0) {
LAB_00df95dc:
      local_1e0 = pTVar2;
      local_1b0 = (undefined1  [8])pTVar2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::operator<<((ostream *)&local_1a8,"Creating window surface with config ID ");
      std::ostream::operator<<((ostringstream *)&local_1a8,EVar4);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      dVar5 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar5,"init",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateSurfaceTests.cpp"
                       ,0x89);
      pNVar3 = (((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->m_nativeDisplay).
               super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.
               m_data.ptr;
      local_1a8 = eglu::parseWindowVisibility
                            (((this->super_SimpleConfigCase).super_TestCase.super_TestCase.
                              super_TestNode.m_testCtx)->m_cmdLine);
      local_1b0 = (undefined1  [8])0x4000000040;
      iVar6 = (*(pNVar7->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                        (pNVar7,pNVar3,local_1f8,local_1e8,0);
      pNVar8 = (NativeWindow *)CONCAT44(extraout_var,iVar6);
      pNVar3 = (((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->m_nativeDisplay).
               super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.
               m_data.ptr;
      bVar1 = this->m_useLegacyCreate;
      window.super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.m_data.
      ptr = pNVar8;
      iVar6 = (*pNVar3->_vptr_NativeDisplay[2])(pNVar3);
      egl_00 = (Library *)CONCAT44(extraout_var_00,iVar6);
      if (bVar1 == false) {
        platformExt = (char *)(pNVar3->m_platformExtension)._M_string_length;
        if (platformExt != (char *)0x0) {
          platformExt = (pNVar3->m_platformExtension)._M_dataplus._M_p;
        }
        checkEGLPlatformSupport(egl_00,platformExt);
        iVar6 = (*pNVar8->_vptr_NativeWindow[3])(pNVar8);
        iVar6 = (*egl_00->_vptr_Library[0xf])
                          (egl_00,local_1f8,local_1e8,CONCAT44(extraout_var_03,iVar6),0);
        surface_00 = (EGLSurface)CONCAT44(extraout_var_04,iVar6);
        dVar5 = (*egl_00->_vptr_Library[0x1f])(egl_00);
        eglu::checkError(dVar5,"eglCreatePlatformWindowSurfaceEXT() failed",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateSurfaceTests.cpp"
                         ,0x50);
      }
      else {
        iVar6 = (*pNVar8->_vptr_NativeWindow[2])(pNVar8);
        iVar6 = (*egl_00->_vptr_Library[0x12])
                          (egl_00,local_1f8,local_1e8,CONCAT44(extraout_var_01,iVar6),0);
        surface_00 = (EGLSurface)CONCAT44(extraout_var_02,iVar6);
        dVar5 = (*egl_00->_vptr_Library[0x1f])(egl_00);
        eglu::checkError(dVar5,"eglCreateWindowSurface() failed",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateSurfaceTests.cpp"
                         ,0x49);
      }
      eglu::UniqueSurface::UniqueSurface(&surface,egl,local_1f8,surface_00);
      windowWidth = 0;
      windowHeight = 0;
      (*egl->_vptr_Library[0x2b])(egl,local_1f8,surface.m_surface,0x3057);
      dVar5 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar5,"querySurface(display, *surface, EGL_WIDTH, &windowWidth)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateSurfaceTests.cpp"
                       ,0x94);
      (*egl->_vptr_Library[0x2b])(egl,local_1f8,surface.m_surface,0x3056,&windowHeight);
      dVar5 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar5,"querySurface(display, *surface, EGL_HEIGHT, &windowHeight)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateSurfaceTests.cpp"
                       ,0x95);
      if ((windowWidth < 1) || (windowHeight < 1)) {
        local_1b0 = (undefined1  [8])local_1e0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::operator<<((ostream *)&local_1a8,"  Fail, invalid surface size ");
        std::ostream::operator<<((ostringstream *)&local_1a8,windowWidth);
        std::operator<<((ostream *)&local_1a8,"x");
        std::ostream::operator<<((ostringstream *)&local_1a8,windowHeight);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        tcu::TestContext::setTestResult
                  ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx,QP_TEST_RESULT_FAIL,"Invalid surface size");
      }
      else {
        local_1b0 = (undefined1  [8])local_1e0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::operator<<((ostream *)&local_1a8,"  Pass");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      }
      eglu::UniqueSurface::~UniqueSurface(&surface);
      de::details::UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::
      ~UniqueBase(&window.
                   super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>);
      return;
    }
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Native window doesn\'t support legacy eglCreateWindowSurface()",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateSurfaceTests.cpp"
               ,0x80);
  }
  else {
    if ((pNVar7->m_capabilities & CAPABILITY_CREATE_SURFACE_PLATFORM) != 0) goto LAB_00df95dc;
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Native window doesn\'t support eglCreatePlatformWindowSurfaceEXT()",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateSurfaceTests.cpp"
               ,0x85);
  }
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void executeForConfig (EGLDisplay display, EGLConfig config)
	{
		const Library&						egl				= m_eglTestCtx.getLibrary();
		TestLog&							log				= m_testCtx.getLog();
		EGLint								id				= eglu::getConfigID(egl, display, config);
		const eglu::NativeWindowFactory&	windowFactory	= eglu::selectNativeWindowFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());

		// \todo [2011-03-23 pyry] Iterate thru all possible combinations of EGL_RENDER_BUFFER, EGL_VG_COLORSPACE and EGL_VG_ALPHA_FORMAT

		if (m_useLegacyCreate)
		{
			if ((windowFactory.getCapabilities() & eglu::NativeWindow::CAPABILITY_CREATE_SURFACE_LEGACY) == 0)
				TCU_THROW(NotSupportedError, "Native window doesn't support legacy eglCreateWindowSurface()");
		}
		else
		{
			if ((windowFactory.getCapabilities() & eglu::NativeWindow::CAPABILITY_CREATE_SURFACE_PLATFORM) == 0)
				TCU_THROW(NotSupportedError, "Native window doesn't support eglCreatePlatformWindowSurfaceEXT()");
		}

		log << TestLog::Message << "Creating window surface with config ID " << id << TestLog::EndMessage;
		EGLU_CHECK_MSG(egl, "init");

		{
			const int							width			= 64;
			const int							height			= 64;
			de::UniquePtr<eglu::NativeWindow>	window			(windowFactory.createWindow(&m_eglTestCtx.getNativeDisplay(), display, config, DE_NULL, eglu::WindowParams(width, height, eglu::parseWindowVisibility(m_testCtx.getCommandLine()))));
			eglu::UniqueSurface					surface			(egl, display, createWindowSurface(display, config, m_eglTestCtx.getNativeDisplay(), *window, m_useLegacyCreate));

			EGLint								windowWidth		= 0;
			EGLint								windowHeight	= 0;

			EGLU_CHECK_CALL(egl, querySurface(display, *surface, EGL_WIDTH,		&windowWidth));
			EGLU_CHECK_CALL(egl, querySurface(display, *surface, EGL_HEIGHT,	&windowHeight));

			if (windowWidth <= 0 || windowHeight <= 0)
			{
				log << TestLog::Message << "  Fail, invalid surface size " << windowWidth << "x" << windowHeight << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid surface size");
			}
			else
				log << TestLog::Message << "  Pass" << TestLog::EndMessage;
		}
	}